

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_eor_32_ai(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint addr_in;
  
  addr_in = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  uVar1 = *(uint *)((long)m68ki_cpu.dar + (ulong)(m68ki_cpu.ir >> 7 & 0x1c));
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar2 = addr_in;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(addr_in);
  }
  uVar3 = m68k_read_memory_32(uVar2 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  uVar3 = uVar3 ^ uVar1;
  m68k_write_memory_32(addr_in & m68ki_cpu.address_mask,uVar3);
  m68ki_cpu.n_flag = uVar3 >> 0x18;
  m68ki_cpu.not_z_flag = uVar3;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_eor_32_ai(void)
{
	uint ea = EA_AY_AI_32();
	uint res = DX ^ m68ki_read_32(ea);

	m68ki_write_32(ea, res);

	FLAG_N = NFLAG_32(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
}